

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O3

void OpenMD::registerLattice(void)

{
  LatticeFactory *pLVar1;
  LatticeCreator *pLVar2;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pLVar1 = LatticeFactory::getInstance();
  pLVar2 = (LatticeCreator *)operator_new(0x28);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"FCC","");
  pLVar2->_vptr_LatticeCreator = (_func_int **)&PTR__LatticeCreator_002f8060;
  (pLVar2->ident_)._M_dataplus._M_p = (pointer)&(pLVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pLVar2->ident_,local_48,local_40 + (long)local_48);
  pLVar2->_vptr_LatticeCreator = (_func_int **)&PTR__LatticeCreator_002f8010;
  LatticeFactory::registerLattice(pLVar1,pLVar2);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  pLVar1 = LatticeFactory::getInstance();
  pLVar2 = (LatticeCreator *)operator_new(0x28);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"SC","");
  pLVar2->_vptr_LatticeCreator = (_func_int **)&PTR__LatticeCreator_002f8060;
  (pLVar2->ident_)._M_dataplus._M_p = (pointer)&(pLVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pLVar2->ident_,local_48,local_40 + (long)local_48);
  pLVar2->_vptr_LatticeCreator = (_func_int **)&PTR__LatticeCreator_002f8088;
  LatticeFactory::registerLattice(pLVar1,pLVar2);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  pLVar1 = LatticeFactory::getInstance();
  pLVar2 = (LatticeCreator *)operator_new(0x28);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"BCC","");
  pLVar2->_vptr_LatticeCreator = (_func_int **)&PTR__LatticeCreator_002f8060;
  (pLVar2->ident_)._M_dataplus._M_p = (pointer)&(pLVar2->ident_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pLVar2->ident_,local_48,local_40 + (long)local_48);
  pLVar2->_vptr_LatticeCreator = (_func_int **)&PTR__LatticeCreator_002f80c8;
  LatticeFactory::registerLattice(pLVar1,pLVar2);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void registerLattice() {
    LatticeFactory::getInstance().registerLattice(
        new LatticeBuilder<FCCLattice>("FCC"));
    LatticeFactory::getInstance().registerLattice(
        new LatticeBuilder<SCLattice>("SC"));
    LatticeFactory::getInstance().registerLattice(
        new LatticeBuilder<BCCLattice>("BCC"));
  }